

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset,
              int depth)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  size_t o;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  int local_5c;
  
  pvVar6 = encoded.bytes;
  uVar10 = encoded.len;
  iVar4 = -2;
  if (100 < depth) {
    return -2;
  }
  sVar11 = *offset;
  uVar9 = sVar11 + 1;
  *offset = uVar9;
  if (uVar10 < uVar9) {
    return -2;
  }
  uVar1 = *(uint8_t *)((long)pvVar6 + sVar11);
  entry->kind = uVar1;
  switch(uVar1) {
  case 'A':
    sVar11 = *offset;
    uVar9 = sVar11 + 4;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar6 + sVar11);
    uVar5 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
            uVar9;
    if (uVar10 < uVar5) {
      return -2;
    }
    pvVar6 = malloc(0x180);
    if (pvVar6 == (void *)0x0) {
      return -1;
    }
    local_5c = 0x10;
    lVar12 = 0;
    uVar10 = 0;
    while (uVar9 < uVar5) {
      pvVar7 = pvVar6;
      if ((long)local_5c <= (long)uVar10) {
        local_5c = local_5c * 2;
        pvVar7 = realloc(pvVar6,(long)local_5c * 0x18);
        iVar4 = -1;
        if (pvVar7 == (void *)0x0) goto LAB_0010a837;
      }
      pvVar6 = pvVar7;
      iVar4 = amqp_decode_field_value
                        (encoded,pool,(amqp_field_value_t *)((long)pvVar6 + lVar12),offset,depth + 1
                        );
      if (iVar4 < 0) goto LAB_0010a837;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x18;
      uVar9 = *offset;
    }
    (entry->value).boolean = (amqp_boolean_t)uVar10;
    sVar11 = (uVar10 & 0xffffffff) * 0x18;
    pvVar7 = amqp_pool_alloc(pool,sVar11);
    (entry->value).bytes.bytes = pvVar7;
    if (pvVar7 == (void *)0x0) {
      iVar4 = -(uint)(uVar10 != 0);
    }
    else {
      memcpy(pvVar7,pvVar6,sVar11);
      iVar4 = 0;
    }
LAB_0010a837:
    free(pvVar6);
    return iVar4;
  case 'B':
switchD_0010a572_caseD_62:
    sVar11 = *offset;
    uVar9 = sVar11 + 1;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar6 + sVar11);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010a572_caseD_63;
  case 'D':
    sVar11 = *offset;
    uVar9 = sVar11 + 1;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar6 + sVar11);
    sVar11 = *offset;
    uVar9 = sVar11 + 4;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar6 + sVar11);
    (entry->value).decimal.value =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 'F':
    iVar4 = amqp_decode_table_internal(encoded,pool,&(entry->value).table,offset,depth + 1);
    return iVar4;
  case 'I':
switchD_0010a572_caseD_66:
    sVar11 = *offset;
    uVar9 = sVar11 + 4;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar6 + sVar11);
    (entry->value).u32 =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 'L':
  case 'T':
switchD_0010a572_caseD_64:
    sVar11 = *offset;
    uVar9 = sVar11 + 8;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    uVar10 = *(ulong *)((long)pvVar6 + sVar11);
    (entry->value).u64 =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    break;
  case 'S':
switchD_0010a5b0_caseD_53:
    sVar11 = *offset;
    uVar9 = sVar11 + 4;
    *offset = uVar9;
    if (uVar10 < uVar9) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar6 + sVar11);
    uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    uVar5 = uVar9 + uVar8;
    *offset = uVar5;
    if (uVar10 < uVar5) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar6 + uVar9);
    (entry->value).i64 = uVar8;
    break;
  case 'V':
    break;
  default:
    switch(uVar1) {
    case 'b':
      goto switchD_0010a572_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010a572_caseD_63;
    case 'd':
    case 'l':
      goto switchD_0010a572_caseD_64;
    case 'f':
    case 'i':
      goto switchD_0010a572_caseD_66;
    case 's':
    case 'u':
      sVar11 = *offset;
      uVar9 = sVar11 + 2;
      *offset = uVar9;
      if (uVar10 < uVar9) {
        return -2;
      }
      uVar2 = *(ushort *)((long)pvVar6 + sVar11);
      (entry->value).u16 = uVar2 << 8 | uVar2 >> 8;
      break;
    case 't':
      sVar11 = *offset;
      uVar9 = sVar11 + 1;
      *offset = uVar9;
      if (uVar10 < uVar9) {
        return -2;
      }
      *(uint *)&entry->value = (uint)(*(char *)((long)pvVar6 + sVar11) != '\0');
      break;
    default:
      if (uVar1 != 'x') {
        return -2;
      }
      goto switchD_0010a5b0_caseD_53;
    }
  }
  iVar4 = 0;
switchD_0010a572_caseD_63:
  return iVar4;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded, amqp_pool_t *pool,
                                   amqp_field_value_t *entry, size_t *offset,
                                   int depth) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (depth > TABLE_DEPTH_LIMIT) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits)                                          \
  if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; \
  break
#define SIMPLE_FIELD_DECODER(bits, dest, how)                 \
  {                                                           \
    uint##bits##_t val;                                       \
    if (!amqp_decode_##bits(encoded, offset, &val)) goto out; \
    entry->value.dest = how;                                  \
  }                                                           \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
    case AMQP_FIELD_KIND_U8:
      TRIVIAL_FIELD_DECODER(8);

    case AMQP_FIELD_KIND_I16:
      SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
    case AMQP_FIELD_KIND_U16:
      TRIVIAL_FIELD_DECODER(16);

    case AMQP_FIELD_KIND_I32:
      SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
    case AMQP_FIELD_KIND_U32:
      TRIVIAL_FIELD_DECODER(32);

    case AMQP_FIELD_KIND_I64:
      SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
    case AMQP_FIELD_KIND_U64:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_F32:
      TRIVIAL_FIELD_DECODER(32);
      /* and by punning, f32 magically gets the right value...! */

    case AMQP_FIELD_KIND_F64:
      TRIVIAL_FIELD_DECODER(64);
      /* and by punning, f64 magically gets the right value...! */

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals) ||
          !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES: {
      uint32_t len;
      if (!amqp_decode_32(encoded, offset, &len) ||
          !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
        goto out;
      }
      break;
    }

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_decode_array(encoded, pool, &(entry->value.array), offset,
                              depth + 1);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_decode_table_internal(encoded, pool, &(entry->value.table),
                                       offset, depth + 1);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}